

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

bool duckdb::Leaf::DeprecatedGetRowIds
               (ART *art,Node *node,unsafe_vector<row_t> *row_ids,idx_t max_count)

{
  Node ptr;
  Leaf *pLVar1;
  ulong uVar2;
  uint8_t i;
  ulong uVar3;
  Leaf *__x;
  
  while( true ) {
    ptr.super_IndexPointer.data = (IndexPointer)(node->super_IndexPointer).data;
    uVar3 = (ulong)ptr.super_IndexPointer.data >> 0x38;
    if (uVar3 == 0) break;
    pLVar1 = Node::Ref<duckdb::Leaf_const>(art,ptr,LEAF);
    uVar2 = (ulong)pLVar1->count;
    if (max_count <
        ((long)(row_ids->super_vector<long,_std::allocator<long>_>).
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)(row_ids->super_vector<long,_std::allocator<long>_>).
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start >> 3) + uVar2) break;
    __x = pLVar1;
    for (uVar3 = 0; __x = (Leaf *)__x->row_ids, uVar3 < uVar2; uVar3 = uVar3 + 1) {
      ::std::vector<long,_std::allocator<long>_>::push_back
                (&row_ids->super_vector<long,_std::allocator<long>_>,(value_type_conflict5 *)__x);
      uVar2 = (ulong)pLVar1->count;
    }
    node = &pLVar1->ptr;
  }
  return uVar3 == 0;
}

Assistant:

bool Leaf::DeprecatedGetRowIds(ART &art, const Node &node, unsafe_vector<row_t> &row_ids, const idx_t max_count) {
	D_ASSERT(node.GetType() == LEAF);

	reference<const Node> ref(node);
	while (ref.get().HasMetadata()) {

		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		if (row_ids.size() + leaf.count > max_count) {
			return false;
		}
		for (uint8_t i = 0; i < leaf.count; i++) {
			row_ids.push_back(leaf.row_ids[i]);
		}
		ref = leaf.ptr;
	}
	return true;
}